

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors1ReturnChain
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  initializer_list<unsigned_long> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  undefined8 uVar1;
  size_t in_stack_fffffffffffffef8;
  undefined1 unique;
  undefined2 local_fc;
  undefined2 local_fa;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  *in_stack_ffffffffffffff20;
  pointer local_d0;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  size_t local_98;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  
  determineVectorParams(&vectorParams,this,&commandData->params);
  if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_98 = returnParam;
    __l._M_len = 1;
    __l._M_array = &local_98;
    unique = definition;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_b0,__l,(allocator_type *)&stack0xfffffffffffffeff);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::_Rb_tree(&local_90,&vectorParams._M_t);
    local_fa = 0x201;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_fa;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&local_c8,__l_00,(allocator_type *)&stack0xfffffffffffffefe);
    local_fc = 0x201;
    uVar1 = 0x169084;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&local_fc;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *
           )&stack0xffffffffffffff20,__l_01,(allocator_type *)&stack0xfffffffffffffefd);
    returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_90;
    returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_b0;
    returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&stack0xffffffffffffff20;
    vectorParams_00._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&local_c8));
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar1;
    vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffef8;
    generateCommandSetInclusive
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,definition,returnParams
               ,vectorParams_00,(bool)unique,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)this,SUB81(__return_storage_ptr__,0),SUB81(name,0),in_stack_ffffffffffffff20);
    if (in_stack_ffffffffffffff20 !=
        (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *)
        0x0) {
      operator_delete(in_stack_ffffffffffffff20,(long)local_d0 - (long)in_stack_ffffffffffffff20);
    }
    if (local_c8.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_90);
    if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors1ReturnChain(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( vectorParams.empty() )
  {
    return generateCommandSetInclusive( name,
                                        commandData,
                                        initialSkipCount,
                                        definition,
                                        { returnParam },
                                        vectorParams,
                                        false,
                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                        raii,
                                        false,
                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
  }
  return "";
}